

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmetrics.cpp
# Opt level: O0

void rereadFile(MultiPartInputFile *in,vector<partData,_std::allocator<partData>_> *parts,
               fileMetrics *metrics)

{
  __type _Var1;
  TiledInputPart *pTVar2;
  string *psVar3;
  reference pvVar4;
  DeepFrameBuffer *in_RDX;
  DeepTiledInputPart *in_RSI;
  MultiPartInputFile *in_RDI;
  DeepTiledInputPart inpart_3;
  DeepScanLineInputPart inpart_2;
  TiledInputPart inpart_1;
  InputPart inpart;
  string type;
  size_t p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff90;
  FrameBuffer *in_stack_ffffffffffffff98;
  InputPart *in_stack_ffffffffffffffa0;
  InputPart local_48 [8];
  string local_40 [8];
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffc8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffd0;
  DeepFrameBuffer *in_stack_ffffffffffffffd8;
  TiledInputPart *pTVar5;
  TiledInputPart *in_00;
  
  pTVar5 = (TiledInputPart *)0x0;
  while (in_00 = pTVar5,
        pTVar2 = (TiledInputPart *)
                 std::vector<partData,_std::allocator<partData>_>::size
                           ((vector<partData,_std::allocator<partData>_> *)in_RSI), pTVar5 < pTVar2)
  {
    Imf_3_4::MultiPartInputFile::header((int)in_RDI);
    psVar3 = (string *)Imf_3_4::Header::type_abi_cxx11_();
    std::__cxx11::string::string(local_40,psVar3);
    _Var1 = std::operator==(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    if (_Var1) {
      Imf_3_4::InputPart::InputPart(local_48,in_RDI,(int)in_00);
      pvVar4 = std::vector<partData,_std::allocator<partData>_>::operator[]
                         ((vector<partData,_std::allocator<partData>_> *)in_RSI,(size_type)in_00);
      in_stack_ffffffffffffff80 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &(pvVar4->rereadBuf).scanlineBuf;
      std::vector<partStats,_std::allocator<partStats>_>::operator[]
                ((vector<partStats,_std::allocator<partStats>_> *)in_RDX,(size_type)in_00);
      readScanLine(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    }
    else {
      _Var1 = std::operator==(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      if (_Var1) {
        Imf_3_4::TiledInputPart::TiledInputPart
                  ((TiledInputPart *)&stack0xffffffffffffffa0,in_RDI,(int)in_00);
        pvVar4 = std::vector<partData,_std::allocator<partData>_>::operator[]
                           ((vector<partData,_std::allocator<partData>_> *)in_RSI,(size_type)in_00);
        in_stack_ffffffffffffff78 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &(pvVar4->rereadBuf).tiledBuf;
        std::vector<partStats,_std::allocator<partStats>_>::operator[]
                  ((vector<partStats,_std::allocator<partStats>_> *)in_RDX,(size_type)in_00);
        readTiled(in_00,(vector<Imf_3_4::FrameBuffer,_std::allocator<Imf_3_4::FrameBuffer>_> *)
                        in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
      }
      else {
        _Var1 = std::operator==(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
        if (_Var1) {
          Imf_3_4::DeepScanLineInputPart::DeepScanLineInputPart
                    ((DeepScanLineInputPart *)&stack0xffffffffffffff98,in_RDI,(int)in_00);
          std::vector<partData,_std::allocator<partData>_>::operator[]
                    ((vector<partData,_std::allocator<partData>_> *)in_RSI,(size_type)in_00);
          std::vector<partStats,_std::allocator<partStats>_>::operator[]
                    ((vector<partStats,_std::allocator<partStats>_> *)in_RDX,(size_type)in_00);
          std::vector<partStats,_std::allocator<partStats>_>::operator[]
                    ((vector<partStats,_std::allocator<partStats>_> *)in_RDX,(size_type)in_00);
          readDeepScanLine((DeepScanLineInputPart *)in_00,in_stack_ffffffffffffffd8,
                           in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
        }
        else {
          _Var1 = std::operator==(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
          if (_Var1) {
            Imf_3_4::DeepTiledInputPart::DeepTiledInputPart
                      ((DeepTiledInputPart *)&stack0xffffffffffffff90,in_RDI,(int)in_00);
            std::vector<partData,_std::allocator<partData>_>::operator[]
                      ((vector<partData,_std::allocator<partData>_> *)in_RSI,(size_type)in_00);
            std::vector<partStats,_std::allocator<partStats>_>::operator[]
                      ((vector<partStats,_std::allocator<partStats>_> *)in_RDX,(size_type)in_00);
            std::vector<partStats,_std::allocator<partStats>_>::operator[]
                      ((vector<partStats,_std::allocator<partStats>_> *)in_RDX,(size_type)in_00);
            readDeepTiled(in_RSI,in_RDX,(vector<double,_std::allocator<double>_> *)in_00,
                          (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffffd8);
          }
        }
      }
    }
    std::__cxx11::string::~string(local_40);
    pTVar5 = in_00 + 1;
  }
  return;
}

Assistant:

void
rereadFile (
    MultiPartInputFile& in, vector<partData>& parts, fileMetrics& metrics)
{
    //
    // Call initialization functions, Read image from source.
    //
    for (size_t p = 0; p < parts.size (); ++p)
    {
        string type = in.header (p).type ();

        if (type == SCANLINEIMAGE)
        {
            InputPart inpart (in, p);
            readScanLine (
                inpart,
                parts[p].rereadBuf.scanlineBuf,
                metrics.stats[p].rereadPerf);
        }
        else if (type == TILEDIMAGE)
        {
            TiledInputPart inpart (in, p);
            readTiled (
                inpart,
                parts[p].rereadBuf.tiledBuf,
                metrics.stats[p].rereadPerf);
        }
        else if (type == DEEPSCANLINE)
        {
            DeepScanLineInputPart inpart (in, p);
            readDeepScanLine (
                inpart,
                parts[p].rereadBuf.deepbuf,
                metrics.stats[p].rereadPerf,
                metrics.stats[p].countRereadPerf);
        }
        else if (type == DEEPTILE)
        {
            DeepTiledInputPart inpart (in, p);
            readDeepTiled (
                inpart,
                parts[p].rereadBuf.deepbuf,
                metrics.stats[p].rereadPerf,
                metrics.stats[p].countRereadPerf);
        }
    }
}